

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calc_state_machine.hxx
# Opt level: O0

bool __thiscall
calc_server::calc_state_machine::apply_snapshot(calc_state_machine *this,snapshot *s)

{
  bool bVar1;
  iterator __i;
  snapshot *in_RSI;
  map<unsigned_long,_std::shared_ptr<calc_server::calc_state_machine::snapshot_ctx>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<calc_server::calc_state_machine::snapshot_ctx>_>_>_>
  *in_RDI;
  ptr<snapshot_ctx> ctx;
  iterator entry;
  lock_guard<std::mutex> ll;
  lock_guard<std::mutex> *in_stack_ffffffffffffff90;
  shared_ptr<calc_server::calc_state_machine::snapshot_ctx> *this_00;
  __atomic_base<long> *in_stack_ffffffffffffffa0;
  _Self local_48 [3];
  ulong local_30;
  _Self local_28 [2];
  snapshot *local_18;
  byte local_1;
  
  local_18 = in_RSI;
  std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffff90,(mutex_type *)in_RDI);
  this_00 = (shared_ptr<calc_server::calc_state_machine::snapshot_ctx> *)
            ((long)&(in_RDI->_M_t)._M_impl + 0x18);
  local_30 = nuraft::snapshot::get_last_log_idx(local_18);
  __i = std::
        map<unsigned_long,_std::shared_ptr<calc_server::calc_state_machine::snapshot_ctx>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<calc_server::calc_state_machine::snapshot_ctx>_>_>_>
        ::find(in_RDI,(key_type *)0x18ec60);
  local_28[0]._M_node = __i._M_node;
  local_48[0]._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_std::shared_ptr<calc_server::calc_state_machine::snapshot_ctx>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<calc_server::calc_state_machine::snapshot_ctx>_>_>_>
       ::end(in_RDI);
  bVar1 = std::operator==(local_28,local_48);
  if (bVar1) {
    local_1 = 0;
  }
  else {
    std::
    _Rb_tree_iterator<std::pair<const_unsigned_long,_std::shared_ptr<calc_server::calc_state_machine::snapshot_ctx>_>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_long,_std::shared_ptr<calc_server::calc_state_machine::snapshot_ctx>_>_>
                  *)0x18eccb);
    std::shared_ptr<calc_server::calc_state_machine::snapshot_ctx>::shared_ptr
              (this_00,(shared_ptr<calc_server::calc_state_machine::snapshot_ctx> *)in_RDI);
    std::
    __shared_ptr_access<calc_server::calc_state_machine::snapshot_ctx,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<calc_server::calc_state_machine::snapshot_ctx,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x18ece6);
    std::__atomic_base<long>::operator=(in_stack_ffffffffffffffa0,(__int_type_conflict2)__i._M_node)
    ;
    local_1 = 1;
    std::shared_ptr<calc_server::calc_state_machine::snapshot_ctx>::~shared_ptr
              ((shared_ptr<calc_server::calc_state_machine::snapshot_ctx> *)0x18ed0e);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x18ed18);
  return (bool)(local_1 & 1);
}

Assistant:

bool apply_snapshot(snapshot& s) {
        std::lock_guard<std::mutex> ll(snapshots_lock_);
        auto entry = snapshots_.find(s.get_last_log_idx());
        if (entry == snapshots_.end()) return false;

        ptr<snapshot_ctx> ctx = entry->second;
        cur_value_ = ctx->value_;
        return true;
    }